

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STInteger.cpp
# Opt level: O1

string * __thiscall
jbcoin::STInteger<unsigned_short>::getText_abi_cxx11_
          (string *__return_storage_ptr__,STInteger<unsigned_short> *this)

{
  pointer pcVar1;
  Item *pIVar2;
  unsigned_short in_DX;
  unsigned_short extraout_DX;
  unsigned_short extraout_DX_00;
  
  if (((this->super_STBase).fName)->fieldCode == sfLedgerEntryType) {
    LedgerFormats::getInstance();
    pIVar2 = KnownFormats<jbcoin::LedgerEntryType>::findByType
                       (&LedgerFormats::getInstance::instance.
                         super_KnownFormats<jbcoin::LedgerEntryType>,(uint)this->value_);
    in_DX = extraout_DX;
    if (pIVar2 == (Item *)0x0) goto LAB_001b3efd;
LAB_001b3f26:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (pIVar2->m_name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (pIVar2->m_name)._M_string_length);
  }
  else {
LAB_001b3efd:
    if (((this->super_STBase).fName)->fieldCode == sfTransactionType) {
      TxFormats::getInstance();
      pIVar2 = (Item *)KnownFormats<jbcoin::TxType>::findByType
                                 (&TxFormats::getInstance::instance.
                                   super_KnownFormats<jbcoin::TxType>,(uint)this->value_);
      in_DX = extraout_DX_00;
      if (pIVar2 != (Item *)0x0) goto LAB_001b3f26;
    }
    beast::lexicalCastThrow<std::__cxx11::string,unsigned_short>
              (__return_storage_ptr__,(beast *)(ulong)this->value_,in_DX);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
STUInt16::getText () const
{
    if (getFName () == sfLedgerEntryType)
    {
        auto item = LedgerFormats::getInstance ().findByType (
            static_cast <LedgerEntryType> (value_));

        if (item != nullptr)
            return item->getName ();
    }

    if (getFName () == sfTransactionType)
    {
        auto item =TxFormats::getInstance().findByType (
            static_cast <TxType> (value_));

        if (item != nullptr)
            return item->getName ();
    }

    return beast::lexicalCastThrow <std::string> (value_);
}